

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O2

int byte_sequence_to_str(char *buffer,uint8_t *bytes,uint bytes_len,uint tabstops)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = tabstops;
  while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
    buffer[0] = '\t';
    buffer[1] = '\0';
    buffer = buffer + 1;
  }
  uVar2 = 1;
  for (uVar5 = 0; uVar5 != bytes_len; uVar5 = uVar5 + 1) {
    iVar3 = sprintf(buffer,"%02X ",(ulong)bytes[uVar5]);
    if ((uVar2 & 0xf) == 0) {
      buffer = buffer + iVar3;
      buffer[0] = '\n';
      buffer[1] = '\0';
      uVar4 = tabstops;
      while( true ) {
        buffer = buffer + 1;
        bVar6 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar6) break;
        buffer[0] = '\t';
        buffer[1] = '\0';
      }
    }
    else {
      buffer = buffer + iVar3;
    }
    uVar2 = uVar2 + 1;
  }
  if ((bytes_len & 0xf) != 0) {
    buffer[0] = '\n';
    buffer[1] = '\0';
    buffer = buffer + 1;
  }
  buffer[0] = '\n';
  buffer[1] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int byte_sequence_to_str(char *buffer, uint8_t *bytes, unsigned int bytes_len, unsigned int tabstops)
{
	unsigned int bytes_printed = 1;

	for (unsigned int j = 0; j < tabstops; j++)
		buffer += sprintf(buffer, "\t");

	for (unsigned int i = 0; i < bytes_len; i++, bytes_printed++) {
		buffer += sprintf(buffer, "%02X ", bytes[i]);

		/* Only print 16 bytes in a single line. */
		if (bytes_printed % 16 == 0) {
			buffer += sprintf(buffer, "\n");
			for (unsigned int j = 0; j < tabstops; j++)
				buffer += sprintf(buffer, "\t");
		}
	}

	/* If there was no new line printed at the end of the for loop,
	 * print an extra new line.
	 */
	if (bytes_len % 16 != 0)
		buffer += sprintf(buffer, "\n");
	sprintf(buffer, "\n");
	return RTR_BGPSEC_SUCCESS;
}